

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O1

long dprintf_DollarString(char *input,char **end)

{
  byte *pbVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  iVar2 = Curl_isdigit((uint)(byte)*input);
  iVar4 = 0;
  while (iVar2 != 0) {
    iVar4 = (int)*input + iVar4 * 10 + -0x30;
    pbVar1 = (byte *)(input + 1);
    input = input + 1;
    iVar2 = Curl_isdigit((uint)*pbVar1);
  }
  if ((iVar4 == 0) || (*input != '$')) {
    lVar3 = 0;
  }
  else {
    *end = input + 1;
    lVar3 = (long)iVar4;
  }
  return lVar3;
}

Assistant:

static long dprintf_DollarString(char *input, char **end)
{
  int number = 0;
  while(ISDIGIT(*input)) {
    number *= 10;
    number += *input-'0';
    input++;
  }
  if(number && ('$'==*input++)) {
    *end = input;
    return number;
  }
  return 0;
}